

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_frame.cpp
# Opt level: O0

MPP_RET mpp_frame_init(MppFrame *frame)

{
  MppFrameImpl *frame_00;
  MppFrameImpl *p;
  MppFrame *frame_local;
  
  if (frame == (MppFrame *)0x0) {
    _mpp_log_l(2,"mpp_frame","invalid NULL pointer input\n","mpp_frame_init");
    frame_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    frame_00 = (MppFrameImpl *)mpp_mem_pool_get_f("mpp_frame_init",mpp_frame_pool);
    if (frame_00 == (MppFrameImpl *)0x0) {
      _mpp_log_l(2,"mpp_frame","malloc failed\n","mpp_frame_init");
      frame_local._4_4_ = MPP_ERR_NULL_PTR;
    }
    else {
      setup_mpp_frame_name(frame_00);
      setup_mpp_frame_defaults(frame_00);
      *frame = frame_00;
      frame_local._4_4_ = MPP_OK;
    }
  }
  return frame_local._4_4_;
}

Assistant:

MPP_RET mpp_frame_init(MppFrame *frame)
{
    if (NULL == frame) {
        mpp_err_f("invalid NULL pointer input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppFrameImpl *p = (MppFrameImpl*)mpp_mem_pool_get(mpp_frame_pool);
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_NULL_PTR;
    }

    setup_mpp_frame_name(p);
    setup_mpp_frame_defaults(p);
    *frame = p;

    return MPP_OK;
}